

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# button.c
# Opt level: O0

natwm_error
button_handle_grab(natwm_state *state,xcb_button_press_event_t *event,xcb_rectangle_t *monitor_rect,
                  client *client)

{
  client *client_local;
  xcb_rectangle_t *monitor_rect_local;
  xcb_button_press_event_t *event_local;
  natwm_state *state_local;
  
  if (event->same_screen == '\0') {
    internal_logger(natwm_logger,LEVEL_ERROR,
                    "Receieved a grab event which did not occur on the root window");
    state_local._4_4_ = INVALID_INPUT_ERROR;
  }
  else if (state->button_state->grabbed_client == (client *)0x0) {
    if ((client->is_fullscreen & 1U) == 0) {
      natwm_state_lock(state);
      state->button_state->grabbed_client = client;
      state->button_state->monitor_rect = monitor_rect;
      state->button_state->start_x = event->event_x;
      state->button_state->start_y = event->event_y;
      natwm_state_unlock(state);
      if (event->detail == '\x03') {
        initialize_resize_helper(state,monitor_rect,client);
      }
      state_local._4_4_ = NO_ERROR;
    }
    else {
      state_local._4_4_ = NO_ERROR;
    }
  }
  else {
    internal_logger(natwm_logger,LEVEL_ERROR,"Attempting to grab a second client");
    state_local._4_4_ = RESOLUTION_FAILURE;
  }
  return state_local._4_4_;
}

Assistant:

enum natwm_error button_handle_grab(struct natwm_state *state,
                                    const xcb_button_press_event_t *event,
                                    xcb_rectangle_t *monitor_rect, struct client *client)
{
        if (!event->same_screen) {
                LOG_ERROR(natwm_logger,
                          "Receieved a grab event which did not occur on the root window");

                return INVALID_INPUT_ERROR;
        }

        if (state->button_state->grabbed_client != NULL) {
                LOG_ERROR(natwm_logger, "Attempting to grab a second client");

                return RESOLUTION_FAILURE;
        }

        if (client->is_fullscreen) {
                // Ignore clients if they are currently fullscreen
                return NO_ERROR;
        }

        natwm_state_lock(state);

        state->button_state->grabbed_client = client;
        state->button_state->monitor_rect = monitor_rect;
        state->button_state->start_x = event->event_x;
        state->button_state->start_y = event->event_y;

        natwm_state_unlock(state);

        if (event->detail == XCB_BUTTON_INDEX_3) {
                initialize_resize_helper(state, monitor_rect, client);
        }

        return NO_ERROR;
}